

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int seek_pack(archive_read *a)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  int64_t iVar4;
  
  pvVar1 = a->format->data;
  if (*(int *)((long)pvVar1 + 0x114) == 0) {
    archive_set_error(&a->archive,-1,"Damaged 7-Zip archive");
LAB_001f9199:
    iVar3 = -0x1e;
  }
  else {
    *(undefined8 *)((long)pvVar1 + 0x118) =
         *(undefined8 *)
          (*(long *)((long)pvVar1 + 0x10) + (ulong)*(uint *)((long)pvVar1 + 0x110) * 8);
    lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x28) + (ulong)*(uint *)((long)pvVar1 + 0x110) * 8);
    if (*(long *)((long)pvVar1 + 0xf8) != lVar2) {
      iVar4 = __archive_read_seek(a,*(long *)((long)pvVar1 + 0x88) + lVar2,0);
      if (iVar4 < 0) goto LAB_001f9199;
      *(long *)((long)pvVar1 + 0xf8) = lVar2;
    }
    *(ulong *)((long)pvVar1 + 0x110) =
         CONCAT44((int)((ulong)*(undefined8 *)((long)pvVar1 + 0x110) >> 0x20) + -1,
                  (int)*(undefined8 *)((long)pvVar1 + 0x110) + 1);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
seek_pack(struct archive_read *a)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	int64_t pack_offset;

	if (zip->pack_stream_remaining <= 0) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->pack_stream_inbytes_remaining =
	    zip->si.pi.sizes[zip->pack_stream_index];
	pack_offset = zip->si.pi.positions[zip->pack_stream_index];
	if (zip->stream_offset != pack_offset) {
		if (0 > __archive_read_seek(a, pack_offset + zip->seek_base,
		    SEEK_SET))
			return (ARCHIVE_FATAL);
		zip->stream_offset = pack_offset;
	}
	zip->pack_stream_index++;
	zip->pack_stream_remaining--;
	return (ARCHIVE_OK);
}